

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

Var Js::JavascriptProxy::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptProxy *pJVar5;
  int in_stack_00000010;
  Arguments local_48;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x2b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cf5607;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_38 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_38 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x2e,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) {
LAB_00cf5607:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((local_38._0_4_ >> 0x18 & 1) != 0) {
    local_48.Info = (Type)local_38;
    local_48.Values = (Type)args.super_Arguments.Info;
    pJVar5 = Create(pSVar1,&local_48);
    return pJVar5;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ebf5,L"Proxy");
}

Assistant:

Var JavascriptProxy::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Proxy, scriptContext);

        if (!(args.Info.Flags & CallFlags_New))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Proxy"));
        }

        JavascriptProxy* proxy = JavascriptProxy::Create(scriptContext, args);
        return proxy;
    }